

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

CategoricalDistributionLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_categoricaldistribution(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x4ce) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4ce;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    CategoricalDistributionLayerParams::CategoricalDistributionLayerParams
              (this_00.categoricaldistribution_);
    (this->layer_).categoricaldistribution_ = (CategoricalDistributionLayerParams *)this_00;
  }
  return (CategoricalDistributionLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::CategoricalDistributionLayerParams* NeuralNetworkLayer::mutable_categoricaldistribution() {
  if (!has_categoricaldistribution()) {
    clear_layer();
    set_has_categoricaldistribution();
    layer_.categoricaldistribution_ = new ::CoreML::Specification::CategoricalDistributionLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.categoricalDistribution)
  return layer_.categoricaldistribution_;
}